

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitForInOrForOf(ParseNodeForInOrForOf *loopNode,ByteCodeGenerator *byteCodeGenerator,
                     FuncInfo *funcInfo,BOOL fReturnValue)

{
  RegSlot R0;
  RegSlot R0_00;
  code *pcVar1;
  bool bVar2;
  ByteCodeLabel loopEntrance_00;
  ByteCodeLabel labelID;
  ByteCodeLabel BVar3;
  RegSlot methodReg;
  RegSlot RVar4;
  ByteCodeLabel labelID_00;
  uint loopId_00;
  undefined4 *puVar5;
  ByteCodeWriter *pBVar6;
  FuncInfo *pFVar7;
  bool bVar8;
  bool isAsync;
  RegSlot doneLocation;
  uint loopId;
  ByteCodeLabel catchLabel;
  ByteCodeLabel finallyLabel;
  RegSlot tmpObj;
  RegSlot nextMethodReg;
  bool isCoroutine;
  RegSlot shouldCallReturnFunctionLocationFinally;
  RegSlot shouldCallReturnFunctionLocation;
  RegSlot regOffset;
  RegSlot regException;
  ByteCodeLabel skipThrow;
  ByteCodeLabel continuePastLoop;
  ByteCodeLabel loopEntrance;
  bool isForAwaitOf;
  bool isForIn;
  BOOL fReturnValue_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeForInOrForOf *loopNode_local;
  
  bVar8 = (loopNode->super_ParseNodeStmt).super_ParseNode.nop != knopForIn;
  isAsync = (loopNode->super_ParseNodeStmt).super_ParseNode.nop == knopForAwaitOf;
  if (((!isAsync) && (bVar8)) && ((loopNode->super_ParseNodeStmt).super_ParseNode.nop != knopForOf))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x266f,"(isForAwaitOf || isForIn || loopNode->nop == knopForOf)",
                       "isForAwaitOf || isForIn || loopNode->nop == knopForOf");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BeginEmitBlock(loopNode->pnodeBlock,byteCodeGenerator,funcInfo);
  ByteCodeGenerator::StartStatement(byteCodeGenerator,(ParseNode *)loopNode);
  if (bVar8) {
    FuncInfo::AcquireLoc(funcInfo,(ParseNode *)loopNode);
  }
  pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::RecordStatementAdjustment(pBVar6,SAT_All);
  bVar2 = ParseNodeBlock::HasBlockScopedContent(loopNode->pnodeBlock);
  if (bVar2) {
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::RecordForInOrOfCollectionScope(pBVar6);
  }
  pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
  loopEntrance_00 = Js::ByteCodeWriter::DefineLabel(pBVar6);
  pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar6);
  if (loopNode->pnodeLval->nop == knopVarDecl) {
    EmitReference(loopNode->pnodeLval,byteCodeGenerator,funcInfo);
  }
  Emit(loopNode->pnodeObj,byteCodeGenerator,funcInfo,0,false,false);
  FuncInfo::ReleaseLoc(funcInfo,loopNode->pnodeObj);
  EndEmitBlock(loopNode->pnodeBlock,byteCodeGenerator,funcInfo);
  if (loopNode->pnodeBlock->scope != (Scope *)0x0) {
    Scope::
    ForEachSymbol<EmitForInOrForOf(ParseNodeForInOrForOf*,ByteCodeGenerator*,FuncInfo*,int)::__0>
              (loopNode->pnodeBlock->scope);
  }
  if (bVar8) {
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    BVar3 = Js::ByteCodeWriter::DefineLabel(pBVar6);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::BrReg2
              (pBVar6,BrNeq_A,BVar3,loopNode->pnodeObj->location,funcInfo->undefinedConstantRegister
              );
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::W1(pBVar6,RuntimeTypeError,0x1610);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar6,BVar3);
    shouldCallReturnFunctionLocation = 0xffffffff;
    shouldCallReturnFunctionLocationFinally = 0xffffffff;
    R0 = loopNode->shouldCallReturnFunctionLocation;
    R0_00 = loopNode->shouldCallReturnFunctionLocationFinally;
    bVar8 = Js::FunctionProxy::IsCoroutine(&funcInfo->byteCodeFunction->super_FunctionProxy);
    if (bVar8) {
      shouldCallReturnFunctionLocation = FuncInfo::AcquireTmpRegister(funcInfo);
      shouldCallReturnFunctionLocationFinally = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    methodReg = FuncInfo::AcquireTmpRegister(funcInfo);
    RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
    loopNode->itemLocation = RVar4;
    ByteCodeGenerator::SetHasFinally(byteCodeGenerator,true);
    ByteCodeGenerator::SetHasTry(byteCodeGenerator,true);
    pFVar7 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    Js::ParseableFunctionInfo::SetDontInline(pFVar7->byteCodeFunction,true);
    RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg2(pBVar6,Conv_Obj,RVar4,loopNode->pnodeObj->location);
    if (isAsync) {
      EmitGetAsyncIterator
                ((loopNode->super_ParseNodeStmt).super_ParseNode.location,RVar4,byteCodeGenerator,
                 funcInfo);
    }
    else {
      EmitGetIterator((loopNode->super_ParseNodeStmt).super_ParseNode.location,RVar4,
                      byteCodeGenerator,funcInfo);
    }
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
    EmitGetObjectMethod(methodReg,(loopNode->super_ParseNodeStmt).super_ParseNode.location,0x107,
                        byteCodeGenerator,funcInfo);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    BVar3 = Js::ByteCodeWriter::DefineLabel(pBVar6);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar6);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(pBVar6,true);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar6,LdFalse,R0);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar6,LdFalse,R0_00);
    if (bVar8) {
      pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::BrReg2
                (pBVar6,TryFinallyWithYield,BVar3,shouldCallReturnFunctionLocation,
                 shouldCallReturnFunctionLocationFinally);
      ByteCodeGenerator::PushJumpCleanupForTry
                (byteCodeGenerator,TryFinallyWithYield,BVar3,shouldCallReturnFunctionLocation,
                 shouldCallReturnFunctionLocationFinally);
    }
    else {
      pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar6,TryFinally,BVar3);
      ByteCodeGenerator::PushJumpCleanupForTry
                (byteCodeGenerator,TryFinally,BVar3,0xffffffff,0xffffffff);
    }
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Br(pBVar6,TryCatch,labelID_00);
    ByteCodeGenerator::PushJumpCleanupForTry
              (byteCodeGenerator,TryCatch,labelID_00,0xffffffff,0xffffffff);
    ByteCodeGenerator::EndStatement(byteCodeGenerator,(ParseNode *)loopNode);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    loopId_00 = Js::ByteCodeWriter::EnterLoop(pBVar6,loopEntrance_00);
    ByteCodeGenerator::PushJumpCleanupForLoop(byteCodeGenerator,(ParseNode *)loopNode,loopId_00);
    ByteCodeGenerator::StartStatement(byteCodeGenerator,loopNode->pnodeLval);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar6,LdFalse,R0);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar6,LdFalse,R0_00);
    EmitFunctionCall(loopNode->itemLocation,methodReg,
                     (loopNode->super_ParseNodeStmt).super_ParseNode.location,byteCodeGenerator,
                     funcInfo);
    if (isAsync) {
      EmitAwait(loopNode->itemLocation,loopNode->itemLocation,byteCodeGenerator,funcInfo);
    }
    EmitThrowOnNotObject(loopNode->itemLocation,byteCodeGenerator);
    RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
    EmitGetObjectProperty(RVar4,loopNode->itemLocation,0x74,byteCodeGenerator,funcInfo);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::BrReg1(pBVar6,BrTrue_A,labelID,RVar4);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
    EmitGetObjectProperty
              (loopNode->itemLocation,loopNode->itemLocation,0x197,byteCodeGenerator,funcInfo);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar6,LdTrue,R0);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar6,LdTrue,R0_00);
    EmitForInOfLoopBody(loopNode,loopEntrance_00,labelID,byteCodeGenerator,funcInfo,fReturnValue);
    ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
    pBVar6 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::ExitLoop(pBVar6,loopId_00);
    FuncInfo::ReleaseTmpRegister(funcInfo,methodReg);
    EmitIteratorCatchAndFinally
              (labelID_00,BVar3,(loopNode->super_ParseNodeStmt).super_ParseNode.location,R0,R0_00,
               shouldCallReturnFunctionLocation,shouldCallReturnFunctionLocationFinally,
               byteCodeGenerator,funcInfo,isAsync);
  }
  else {
    EmitForIn(loopNode,loopEntrance_00,labelID,byteCodeGenerator,funcInfo,fReturnValue);
  }
  return;
}

Assistant:

void EmitForInOrForOf(ParseNodeForInOrForOf *loopNode, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, BOOL fReturnValue)
{
    bool isForIn = (loopNode->nop == knopForIn);
    bool isForAwaitOf = (loopNode->nop == knopForAwaitOf);
    Assert(isForAwaitOf || isForIn || loopNode->nop == knopForOf);

    BeginEmitBlock(loopNode->pnodeBlock, byteCodeGenerator, funcInfo);

    byteCodeGenerator->StartStatement(loopNode);
    if (!isForIn)
    {
        funcInfo->AcquireLoc(loopNode);
    }

    // Record the branch bytecode offset.
    // This is used for "ignore exception" and "set next stmt" scenarios. See ProbeContainer::GetNextUserStatementOffsetForAdvance:
    // If there is a branch recorded between current offset and next stmt offset, we'll use offset of the branch recorded,
    // otherwise use offset of next stmt.
    // The idea here is that when we bail out after ignore exception, we need to bail out to the beginning of the ForIn,
    // but currently ForIn stmt starts at the condition part, which is needed for correct handling of break point on ForIn
    // (break every time on the loop back edge) and correct display of current statement under debugger.
    // See WinBlue 231880 for details.
    byteCodeGenerator->Writer()->RecordStatementAdjustment(Js::FunctionBody::SAT_All);
    if (loopNode->pnodeBlock->HasBlockScopedContent())
    {
        byteCodeGenerator->Writer()->RecordForInOrOfCollectionScope();
    }
    Js::ByteCodeLabel loopEntrance = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel continuePastLoop = byteCodeGenerator->Writer()->DefineLabel();

    if (loopNode->pnodeLval->nop == knopVarDecl)
    {
        EmitReference(loopNode->pnodeLval, byteCodeGenerator, funcInfo);
    }

    Emit(loopNode->pnodeObj, byteCodeGenerator, funcInfo, false); // evaluate collection expression
    funcInfo->ReleaseLoc(loopNode->pnodeObj);

    EndEmitBlock(loopNode->pnodeBlock, byteCodeGenerator, funcInfo);
    if (loopNode->pnodeBlock->scope != nullptr)
    {
        loopNode->pnodeBlock->scope->ForEachSymbol([](Symbol *sym) {
            sym->SetIsTrackedForDebugger(false);
        });
    }

    if (isForIn)
    {
        EmitForIn(loopNode, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, fReturnValue);
        return;
    }

    Js::ByteCodeLabel skipThrow = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrNeq_A, skipThrow, loopNode->pnodeObj->location, funcInfo->undefinedConstantRegister);
    byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ObjectCoercible));
    byteCodeGenerator->Writer()->MarkLabel(skipThrow);

    Js::RegSlot regException = Js::Constants::NoRegister;
    Js::RegSlot regOffset = Js::Constants::NoRegister;

    // These two temp variables track whether the return method of the source iterator should
    // be called. One variable is used for catch block and one is used for finally block.
    // Non-temps are used so that when jitting loop bodies, writes to these variables are not
    // mistaken for dead stores.
    Js::RegSlot shouldCallReturnFunctionLocation = loopNode->shouldCallReturnFunctionLocation;
    Js::RegSlot shouldCallReturnFunctionLocationFinally = loopNode->shouldCallReturnFunctionLocationFinally;

    bool isCoroutine = funcInfo->byteCodeFunction->IsCoroutine();

    if (isCoroutine)
    {
        regException = funcInfo->AcquireTmpRegister();
        regOffset = funcInfo->AcquireTmpRegister();
    }

    // Grab registers for the enumerator and for the current enumerated item.
    // The enumerator register will be released after this call returns.
    Js::RegSlot nextMethodReg = funcInfo->AcquireTmpRegister();
    loopNode->itemLocation = funcInfo->AcquireTmpRegister();

    // We want call profile information on the @@iterator call, so instead of adding a GetForOfIterator bytecode op
    // to do all the following work in a helper do it explicitly in bytecode so that the @@iterator call is exposed
    // to the profiler and JIT.

    byteCodeGenerator->SetHasFinally(true);
    byteCodeGenerator->SetHasTry(true);
    byteCodeGenerator->TopFuncInfo()->byteCodeFunction->SetDontInline(true);

    // do a ToObject on the collection
    Js::RegSlot tmpObj = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Obj, tmpObj, loopNode->pnodeObj->location);

    if (isForAwaitOf)
        EmitGetAsyncIterator(loopNode->location, tmpObj, byteCodeGenerator, funcInfo);
    else
        EmitGetIterator(loopNode->location, tmpObj, byteCodeGenerator, funcInfo);

    funcInfo->ReleaseTmpRegister(tmpObj);

    EmitGetObjectMethod(
        nextMethodReg,
        loopNode->location,
        Js::PropertyIds::next,
        byteCodeGenerator,
        funcInfo);

    // The whole loop is surrounded with try..catch..finally - in order to capture the abrupt completion.
    Js::ByteCodeLabel finallyLabel = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel catchLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(true);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocationFinally);

    if (isCoroutine)
    {
        byteCodeGenerator->Writer()->BrReg2(Js::OpCode::TryFinallyWithYield, finallyLabel, regException, regOffset);
        byteCodeGenerator->PushJumpCleanupForTry(
            Js::OpCode::TryFinallyWithYield,
            finallyLabel,
            regException,
            regOffset);
    }
    else
    {
        byteCodeGenerator->Writer()->Br(Js::OpCode::TryFinally, finallyLabel);
        byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryFinally, finallyLabel);
    }

    byteCodeGenerator->Writer()->Br(Js::OpCode::TryCatch, catchLabel);
    byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryCatch, catchLabel);

    byteCodeGenerator->EndStatement(loopNode);

    // Need to increment loop count whether we are going into profile or not for HasLoop()
    uint loopId = byteCodeGenerator->Writer()->EnterLoop(loopEntrance);
    byteCodeGenerator->PushJumpCleanupForLoop(loopNode, loopId);

    byteCodeGenerator->StartStatement(loopNode->pnodeLval);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocationFinally);

    // Call next on the iterator
    EmitFunctionCall(
        loopNode->itemLocation,
        nextMethodReg,
        loopNode->location,
        byteCodeGenerator,
        funcInfo);

    // If this is a for-await-of then await the iterator next result
    if (isForAwaitOf)
        EmitAwait(loopNode->itemLocation, loopNode->itemLocation, byteCodeGenerator, funcInfo);

    EmitThrowOnNotObject(loopNode->itemLocation, byteCodeGenerator);

    Js::RegSlot doneLocation = funcInfo->AcquireTmpRegister();
    EmitGetObjectProperty(
        doneLocation,
        loopNode->itemLocation,
        Js::PropertyIds::done,
        byteCodeGenerator,
        funcInfo);

    // Branch past loop if the result's done property is truthy
    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, continuePastLoop, doneLocation);
    funcInfo->ReleaseTmpRegister(doneLocation);

    // Otherwise put result's value property in itemLocation
    EmitGetObjectProperty(
        loopNode->itemLocation,
        loopNode->itemLocation,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue, shouldCallReturnFunctionLocationFinally);

    EmitForInOfLoopBody(loopNode, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, fReturnValue);

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->ExitLoop(loopId);
    funcInfo->ReleaseTmpRegister(nextMethodReg);

    EmitIteratorCatchAndFinally(catchLabel,
        finallyLabel,
        loopNode->location,
        shouldCallReturnFunctionLocation,
        shouldCallReturnFunctionLocationFinally,
        regException,
        regOffset,
        byteCodeGenerator,
        funcInfo,
        isForAwaitOf);
}